

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listbox_widget.cpp
# Opt level: O0

void listbox_method_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  long *plVar3;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  byte local_61;
  bool test;
  Am_Object item;
  undefined1 local_50 [8];
  Am_Value_List list;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object listitem;
  Am_Object *self_local;
  
  listitem.data = (Am_Object_Data *)self;
  Am_Object::Get_Owner(&local_28,(Am_Slot_Flags)self);
  Am_Object::Get_Owner(&local_20,(Am_Slot_Flags)&local_28);
  Am_Object::Get_Owner(&local_18,(Am_Slot_Flags)&local_20);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&local_28);
  Am_Object::Get_Owner((Am_Object *)&list.item,(Am_Slot_Flags)&local_18);
  pAVar2 = Am_Object::Get((Am_Object *)&list.item,Am_MULTIPLE_SELECTION,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
  Am_Object::~Am_Object((Am_Object *)&list.item);
  if (bVar1) {
    pAVar2 = Am_Object::Get(&local_18,0x172,0);
    bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
    if (bVar1) {
      Am_Object::Set(&local_18,0x172,false,0);
    }
    else {
      Am_Object::Set(&local_18,0x172,true,0);
    }
  }
  else {
    Am_Object::Get_Owner(&item,(Am_Slot_Flags)&local_18);
    pAVar2 = Am_Object::Get(&item,0x82,0);
    Am_Value_List::Am_Value_List((Am_Value_List *)local_50,pAVar2);
    Am_Object::~Am_Object(&item);
    Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffffa0);
    local_61 = 1;
    Am_Value_List::Start((Am_Value_List *)local_50);
    while (bVar1 = Am_Value_List::Last((Am_Value_List *)local_50), !bVar1 && (local_61 & 1) == 1) {
      pAVar2 = Am_Value_List::Get((Am_Value_List *)local_50);
      Am_Object::operator=((Am_Object *)&stack0xffffffffffffffa0,pAVar2);
      pAVar2 = Am_Object::Get((Am_Object *)&stack0xffffffffffffffa0,0x172,0);
      bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
      if (bVar1) {
        Am_Object::Set((Am_Object *)&stack0xffffffffffffffa0,0x172,false,0);
        local_61 = 0;
      }
      Am_Value_List::Next((Am_Value_List *)local_50);
    }
    Am_Object::Set(&local_18,0x172,true,0);
    Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffa0);
    Am_Value_List::~Am_Value_List((Am_Value_List *)local_50);
  }
  Am_Object::Get_Owner(&local_70,(Am_Slot_Flags)&local_18);
  pAVar2 = Am_Object::Get(&local_70,Am_THIS,0);
  plVar3 = (long *)Am_Value::operator_cast_to_void_(pAVar2);
  (**(code **)(*plVar3 + 0x28))();
  Am_Object::~Am_Object(&local_70);
  Am_Object::Get_Owner(&local_78,(Am_Slot_Flags)&local_18);
  pAVar2 = Am_Object::Get(&local_78,0x172,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
  Am_Object::~Am_Object(&local_78);
  if (bVar1) {
    Am_Object::Get_Owner(&local_80,(Am_Slot_Flags)&local_18);
    Am_Object::Set(&local_80,0x172,false,0);
    Am_Object::~Am_Object(&local_80);
  }
  else {
    Am_Object::Get_Owner(&local_88,(Am_Slot_Flags)&local_18);
    Am_Object::Set(&local_88,0x172,true,0);
    Am_Object::~Am_Object(&local_88);
  }
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, listbox_method, (Am_Object self))
{
  // Get the selected listitem object
  // Owner-chain: interactor-command->interactor->rectangle->listitem-group
  Am_Object listitem = self.Get_Owner().Get_Owner().Get_Owner();

  /// Do we have to handle multiple selects?
  if (static_cast<bool>(listitem.Get_Owner().Get(Am_MULTIPLE_SELECTION)) ==
      true) {
    /// just toggle the select status
    if (static_cast<bool>(listitem.Get(Am_SELECTED)) == true) {
      listitem.Set(Am_SELECTED, false);
    } else {
      listitem.Set(Am_SELECTED, true);
    }
  } else {
    /// Get list of all listitems from listbox object
    Am_Value_List list = listitem.Get_Owner().Get(Am_GRAPHICAL_PARTS);
    Am_Object item;

    /// find the previous selected listitem
    bool test = true;
    for (list.Start(); (list.Last() == false) && (test == true); list.Next()) {
      item = list.Get();
      if (static_cast<bool>(item.Get(Am_SELECTED)) == true) {
        /// and deselect it
        item.Set(Am_SELECTED, false);
        test = false;
      }
    }

    /// set the new listitem as selected
    listitem.Set(Am_SELECTED, true);
  }

  /// and last but not least call the selectMethod through the ABC pointer!
  reinterpret_cast<Am_Listbox_ABC *>(
      static_cast<Am_Ptr>(listitem.Get_Owner().Get(Am_THIS)))
      ->selectMethod();

  /// change the flag of the listbox object so that all constraints/formulas are re-evaluated
  if (static_cast<bool>(listitem.Get_Owner().Get(Am_SELECTED)) == true) {
    listitem.Get_Owner().Set(Am_SELECTED, false);
  } else {
    listitem.Get_Owner().Set(Am_SELECTED, true);
  }

  return;
}